

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powi.c
# Opt level: O0

float powif(float base,int exp)

{
  undefined4 local_1c;
  undefined4 local_18;
  float pow;
  int n;
  float x;
  int exp_local;
  float base_local;
  
  local_1c = 1.0;
  if (exp != 0) {
    local_18 = exp;
    pow = base;
    if (exp < 0) {
      local_18 = -exp;
      pow = 1.0 / base;
    }
    while( true ) {
      if ((local_18 & 1) != 0) {
        local_1c = pow * local_1c;
      }
      local_18 = (int)local_18 >> 1;
      if (local_18 == 0) break;
      pow = pow * pow;
    }
  }
  return local_1c;
}

Assistant:

float powif(float base, int exp)
{
    float x = base;
    int n = exp;
    float pow = 1.0;

    if (n != 0)  {
        if (n < 0) {
            n = -n;
            x = 1 / x;
        }
        for ( ; ; ) {
            if (n & 01)
                pow *= x;
            if (n >>= 1)
                x *= x;
            else
                break;
        }
    }
    return pow;
}